

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

ravi_type_map declare_localvar(LexState *ls,TString **pusertype)

{
  int iVar1;
  TString *name;
  TString *typename;
  TString *pTVar2;
  ravi_type_map tm;
  ravi_type_map rVar3;
  
  name = str_checkname(ls);
  iVar1 = testnext(ls,0x3a);
  tm = 0xffffffff;
  if (iVar1 != 0) {
    typename = str_checkname(ls);
    pTVar2 = typename + 1;
    iVar1 = strcmp((char *)pTVar2,"integer");
    if (iVar1 == 0) {
      rVar3 = 0x20;
      tm = 8;
    }
    else {
      iVar1 = strcmp((char *)pTVar2,"number");
      if (iVar1 != 0) {
        iVar1 = strcmp((char *)pTVar2,"closure");
        if (iVar1 == 0) {
          tm = 0x201;
        }
        else {
          iVar1 = strcmp((char *)pTVar2,"table");
          if (iVar1 == 0) {
            tm = 0x80;
          }
          else {
            iVar1 = strcmp((char *)pTVar2,"string");
            if (iVar1 == 0) {
              tm = 0x101;
            }
            else {
              iVar1 = strcmp((char *)pTVar2,"any");
              if (iVar1 != 0) {
                pTVar2 = user_defined_type_name(ls,typename);
                *pusertype = pTVar2;
                tm = 0x401;
              }
            }
          }
        }
        goto LAB_001210ff;
      }
      rVar3 = 0x40;
      tm = 0x10;
    }
    iVar1 = testnext(ls,0x5b);
    if (iVar1 != 0) {
      checknext(ls,0x5d);
      tm = rVar3;
    }
  }
LAB_001210ff:
  new_localvar(ls,name,tm,*pusertype);
  return tm;
}

Assistant:

static ravi_type_map declare_localvar(LexState *ls, TString **pusertype) {
  /* RAVI change - add type */
  TString *name = str_checkname(ls);
  /* assume a dynamic type */
  ravi_type_map tm = RAVI_TM_ANY;
  /* if the variable name is followed by a colon then we have a type
   * specifier
   */

  if (testnext(ls, ':')) {
    TString *typename = str_checkname(ls); /* we expect a type name */
    const char *str = getstr(typename);
    /* following is not very nice but easy as
     * the lexer doesn't need to be changed
     */
    if (strcmp(str, "integer") == 0)
      tm = RAVI_TM_INTEGER;
    else if (strcmp(str, "number") == 0)
      tm = RAVI_TM_FLOAT;
    else if (strcmp(str, "closure") == 0)
      tm = RAVI_TM_FUNCTION_OR_NIL;
    else if (strcmp(str, "table") == 0)
      tm = RAVI_TM_TABLE;
    else if (strcmp(str, "string") == 0)
      tm = RAVI_TM_STRING_OR_NIL;
    //else if (strcmp(str, "boolean") == 0)
    //  tm = RAVI_TM_BOOLEAN_OR_NIL;
    else if (strcmp(str, "any") == 0)
      tm = RAVI_TM_ANY;
    else {
      /* default is a userdata type */
      tm = RAVI_TM_USERDATA_OR_NIL;
      typename = user_defined_type_name(ls, typename);
      str = getstr(typename);
      *pusertype = typename;
    }
    if (tm == RAVI_TM_FLOAT || tm == RAVI_TM_INTEGER) {
      /* if we see [] then it is an array type */
      if (testnext(ls, '[')) {
        checknext(ls, ']');
        tm = (tm == RAVI_TM_FLOAT) ? RAVI_TM_FLOAT_ARRAY : RAVI_TM_INTEGER_ARRAY;
      }
    }
  }
  new_localvar(ls, name, tm, *pusertype);
  return tm;
}